

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_2::StencilRefSeparateTestCase::test
          (StencilRefSeparateTestCase *this)

{
  CallLogWrapper *this_00;
  RenderTarget *pRVar1;
  int iVar2;
  int iVar3;
  uint mask;
  
  iVar2 = 0;
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (ulong)this->m_testTargetName,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  pRVar1 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  iVar3 = pRVar1->m_stencilBits;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != iVar2; iVar2 = iVar2 + 1) {
    mask = 1 << ((byte)iVar2 & 0x1f);
    glu::CallLogWrapper::glStencilFuncSeparate(this_00,this->m_stencilFuncTargetFace,0x207,mask,0);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               (ulong)this->m_testTargetName,(ulong)mask);
    ApiCase::expectError(&this->super_ApiCase,0);
    glu::CallLogWrapper::glStencilFuncSeparate
              (this_00,this->m_stencilFuncTargetFace,0x207,mask,mask);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               (ulong)this->m_testTargetName,(ulong)mask);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyInteger(m_testCtx, m_testTargetName, 0);
		expectError(GL_NO_ERROR);

		const int stencilBits = m_context.getRenderTarget().getStencilBits();

		for (int stencilBit = 0; stencilBit < stencilBits; ++stencilBit)
		{
			const int ref = 1 << stencilBit;

			glStencilFuncSeparate(m_stencilFuncTargetFace, GL_ALWAYS, ref, 0);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_testTargetName, ref);
			expectError(GL_NO_ERROR);

			glStencilFuncSeparate(m_stencilFuncTargetFace, GL_ALWAYS, ref, ref);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_testTargetName, ref);
			expectError(GL_NO_ERROR);
		}
	}